

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O3

Logging * Logging::getInstance(void)

{
  Logging *this;
  
  if (instance == (Logging *)0x0) {
    this = (Logging *)operator_new(0xe0);
    Logging(this);
    instance = this;
  }
  return instance;
}

Assistant:

Logging* Logging::getInstance()
{
    if (instance == 0) {
        instance = new Logging();
    }
    return instance;
}